

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  char cVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ImGuiID IVar30;
  ImU32 IVar31;
  ImU32 IVar32;
  ImGuiMouseCursor IVar33;
  ImGuiContext_conflict1 *pIVar34;
  ImGuiViewport *pIVar35;
  ImGuiIO *pIVar36;
  ImDrawList *pIVar37;
  ImGuiStyle *pIVar38;
  void *pvVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  int n;
  int obj_i;
  uint uVar43;
  int iVar44;
  ImGuiCond cond;
  bool *pbVar45;
  int i;
  ImGuiWindowFlags flags;
  long lVar46;
  char *pcVar47;
  char *pcVar48;
  int i_12;
  int i_2;
  long lVar49;
  undefined8 *puVar50;
  MyDocument *pMVar51;
  int i_11;
  long lVar52;
  undefined **ppuVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  double dVar57;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar58;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar91;
  undefined1 auVar89 [16];
  int iVar92;
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar106;
  int iVar110;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ImVec2 canvas_sz;
  ImVec2 gradient_size;
  char label [128];
  float local_168;
  float fStack_164;
  undefined4 uStack_15c;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148 [2];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  ImVec2 local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  ImVec2 local_100;
  ImVec2 local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  ImVec2 IStack_e0;
  ImVec2 local_d8;
  ImVec2 IStack_d0;
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  bool *local_60;
  ImVec2 local_58;
  float local_4c;
  ImVec2 local_48;
  undefined8 uStack_40;
  long lVar71;
  
  pIVar34 = GetCurrentContext();
  if (pIVar34 == (ImGuiContext_conflict1 *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                  ,0x112,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar27 = BeginMainMenuBar(), bVar27)) {
    bVar27 = BeginMenu("File",true);
    if (bVar27) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar27 = BeginMenu("Edit",true);
    if (bVar27) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_dockspace == true) {
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      pIVar35 = GetMainViewport();
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      SetNextWindowPos(&pIVar35->WorkPos,0,(ImVec2 *)local_e8);
      SetNextWindowSize(&pIVar35->WorkSize,0);
      SetNextWindowViewport(pIVar35->ID);
      PushStyleVar(3,0.0);
      PushStyleVar(4,0.0);
      uVar40 = 0x282427;
    }
    else {
      ShowExampleAppDockSpace(bool*)::dockspace_flags =
           ShowExampleAppDockSpace(bool*)::dockspace_flags & 0xfffffff7;
      uVar40 = 0x200400;
    }
    uVar43 = ShowExampleAppDockSpace(bool*)::dockspace_flags & 8;
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      PushStyleVar(2,(ImVec2 *)local_e8);
    }
    Begin("DockSpace Demo",&ShowDemoWindow::show_app_dockspace,uVar43 << 4 | uVar40);
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      PopStyleVar(1);
    }
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      PopStyleVar(2);
    }
    pIVar36 = GetIO();
    if ((pIVar36->ConfigFlags & 0x40) == 0) {
      ShowDockingDisabledMessage();
    }
    else {
      IVar30 = GetID("MyDockSpace");
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      DockSpace(IVar30,(ImVec2 *)local_e8,ShowExampleAppDockSpace(bool*)::dockspace_flags,
                (ImGuiWindowClass *)0x0);
    }
    bVar27 = BeginMenuBar();
    if (bVar27) {
      bVar27 = BeginMenu("Options",true);
      if (bVar27) {
        MenuItem("Fullscreen",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_fullscreen,
                 true);
        MenuItem("Padding",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_padding,true);
        Separator();
        bVar27 = MenuItem("Flag: NoSplit","",
                          SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x10) >> 4,0),
                          true);
        if (bVar27) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x10;
        }
        bVar27 = MenuItem("Flag: NoResize","",
                          SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x20) >> 5,0),
                          true);
        if (bVar27) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x20;
        }
        bVar27 = MenuItem("Flag: NoDockingInCentralNode","",
                          SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 4) >> 2,0),true);
        if (bVar27) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 4;
        }
        bVar27 = MenuItem("Flag: AutoHideTabBar","",
                          SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x40) >> 6,0),
                          true);
        if (bVar27) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x40;
        }
        bVar27 = MenuItem("Flag: PassthruCentralNode","",
                          SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 8) >> 3,0),
                          (bool)ShowExampleAppDockSpace(bool*)::opt_fullscreen);
        if (bVar27) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 8;
        }
        Separator();
        bVar27 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar27) {
          ShowDemoWindow::show_app_dockspace = false;
        }
        EndMenu();
      }
      HelpMarker(
                "When docking is enabled, you can ALWAYS dock MOST window into another! Try it now!\n- Drag from window title bar or their tab to dock/undock.\n- Drag from window menu button (upper-left button) to undock an entire node (all windows).\n- Hold SHIFT to disable docking (if io.ConfigDockingWithShift == false, default)\n- Hold SHIFT to enable docking (if io.ConfigDockingWithShift == true)\nThis demo app has nothing to do with enabling docking!\n\nThis demo app only demonstrate the use of ImGui::DockSpace() which allows you to manually create a docking node _within_ another window.\n\nRead comments in ShowExampleAppDockSpace() for more details."
                );
      EndMenuBar();
    }
    End();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar44 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar44 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar27 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if ((bVar27) || (ShowExampleAppDocuments(bool*)::opt_target == 2)) {
      local_138[0] = bVar27;
      bVar27 = BeginMenuBar();
      if (bVar27) {
        bVar27 = BeginMenu("File",true);
        if (bVar27) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar44 = 0;
          }
          else {
            lVar46 = 0;
            iVar44 = 0;
            do {
              iVar44 = iVar44 + (uint)*(byte *)(DAT_00274260 + 8 + lVar46);
              lVar46 = lVar46 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar46);
          }
          bVar27 = BeginMenu("Open",iVar44 < ShowExampleAppDocuments(bool*)::app);
          if (bVar27) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar49 = 8;
              lVar52 = 0;
              lVar46 = DAT_00274260;
              do {
                lVar41 = lVar46;
                if ((*(char *)(lVar46 + lVar49) == '\0') &&
                   (bVar27 = MenuItem(*(char **)(lVar46 + -8 + lVar49),(char *)0x0,false,true),
                   lVar41 = DAT_00274260, bVar27)) {
                  *(undefined1 *)(lVar46 + lVar49) = 1;
                }
                lVar52 = lVar52 + 1;
                lVar49 = lVar49 + 0x20;
                lVar46 = lVar41;
              } while (lVar52 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar27 = MenuItem("Close All Documents",(char *)0x0,false,iVar44 != 0);
          lVar46 = DAT_00274260;
          auVar26 = _DAT_001fd020;
          if ((bVar27) && (0 < (long)ShowExampleAppDocuments(bool*)::app)) {
            uVar40 = ShowExampleAppDocuments(bool*)::app + 0xf;
            lVar49 = (long)ShowExampleAppDocuments(bool*)::app + -1;
            auVar59._8_4_ = (int)lVar49;
            auVar59._0_8_ = lVar49;
            auVar59._12_4_ = (int)((ulong)lVar49 >> 0x20);
            lVar49 = 0;
            auVar60 = auVar59;
            auVar70 = _DAT_001fe240;
            auVar72 = _DAT_001fe250;
            auVar74 = _DAT_001fe260;
            auVar75 = _DAT_001fe270;
            auVar76 = _DAT_001fe280;
            auVar77 = _DAT_001fe290;
            auVar78 = _DAT_001fe210;
            auVar79 = _DAT_001fe220;
            do {
              auVar89 = auVar59 ^ auVar26;
              auVar93 = auVar79 ^ auVar26;
              iVar44 = auVar89._0_4_;
              iVar106 = -(uint)(iVar44 < auVar93._0_4_);
              iVar69 = auVar89._4_4_;
              auVar95._4_4_ = -(uint)(iVar69 < auVar93._4_4_);
              iVar91 = auVar89._8_4_;
              iVar110 = -(uint)(iVar91 < auVar93._8_4_);
              iVar92 = auVar89._12_4_;
              auVar95._12_4_ = -(uint)(iVar92 < auVar93._12_4_);
              auVar89._4_4_ = iVar106;
              auVar89._0_4_ = iVar106;
              auVar89._8_4_ = iVar110;
              auVar89._12_4_ = iVar110;
              auVar89 = pshuflw(auVar60,auVar89,0xe8);
              auVar94._4_4_ = -(uint)(auVar93._4_4_ == iVar69);
              auVar94._12_4_ = -(uint)(auVar93._12_4_ == iVar92);
              auVar94._0_4_ = auVar94._4_4_;
              auVar94._8_4_ = auVar94._12_4_;
              auVar80 = pshuflw(in_XMM11,auVar94,0xe8);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar93 = pshuflw(auVar89,auVar95,0xe8);
              auVar60._8_4_ = 0xffffffff;
              auVar60._0_8_ = 0xffffffffffffffff;
              auVar60._12_4_ = 0xffffffff;
              auVar60 = (auVar93 | auVar80 & auVar89) ^ auVar60;
              auVar60 = packssdw(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0xb + lVar49) = 1;
              }
              auVar80._4_4_ = iVar106;
              auVar80._0_4_ = iVar106;
              auVar80._8_4_ = iVar110;
              auVar80._12_4_ = iVar110;
              auVar95 = auVar94 & auVar80 | auVar95;
              auVar60 = packssdw(auVar95,auVar95);
              auVar93._8_4_ = 0xffffffff;
              auVar93._0_8_ = 0xffffffffffffffff;
              auVar93._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar93,auVar60 ^ auVar93);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._0_4_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x2b + lVar49) = 1;
              }
              auVar60 = auVar78 ^ auVar26;
              auVar81._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar81._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar81._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar81._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar96._4_4_ = auVar81._0_4_;
              auVar96._0_4_ = auVar81._0_4_;
              auVar96._8_4_ = auVar81._8_4_;
              auVar96._12_4_ = auVar81._8_4_;
              iVar106 = -(uint)(auVar60._4_4_ == iVar69);
              iVar110 = -(uint)(auVar60._12_4_ == iVar92);
              auVar13._4_4_ = iVar106;
              auVar13._0_4_ = iVar106;
              auVar13._8_4_ = iVar110;
              auVar13._12_4_ = iVar110;
              auVar107._4_4_ = auVar81._4_4_;
              auVar107._0_4_ = auVar81._4_4_;
              auVar107._8_4_ = auVar81._12_4_;
              auVar107._12_4_ = auVar81._12_4_;
              auVar60 = auVar13 & auVar96 | auVar107;
              auVar60 = packssdw(auVar60,auVar60);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar4,auVar60 ^ auVar4);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x4b + lVar49) = 1;
              }
              auVar60 = pshufhw(auVar60,auVar96,0x84);
              auVar14._4_4_ = iVar106;
              auVar14._0_4_ = iVar106;
              auVar14._8_4_ = iVar110;
              auVar14._12_4_ = iVar110;
              auVar93 = pshufhw(auVar81,auVar14,0x84);
              auVar89 = pshufhw(auVar60,auVar107,0x84);
              auVar61._8_4_ = 0xffffffff;
              auVar61._0_8_ = 0xffffffffffffffff;
              auVar61._12_4_ = 0xffffffff;
              auVar61 = (auVar89 | auVar93 & auVar60) ^ auVar61;
              auVar60 = packssdw(auVar61,auVar61);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x6b + lVar49) = 1;
              }
              auVar60 = auVar77 ^ auVar26;
              auVar82._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar82._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar82._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar82._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar15._4_4_ = auVar82._0_4_;
              auVar15._0_4_ = auVar82._0_4_;
              auVar15._8_4_ = auVar82._8_4_;
              auVar15._12_4_ = auVar82._8_4_;
              auVar93 = pshuflw(auVar107,auVar15,0xe8);
              auVar62._0_4_ = -(uint)(auVar60._0_4_ == iVar44);
              auVar62._4_4_ = -(uint)(auVar60._4_4_ == iVar69);
              auVar62._8_4_ = -(uint)(auVar60._8_4_ == iVar91);
              auVar62._12_4_ = -(uint)(auVar60._12_4_ == iVar92);
              auVar97._4_4_ = auVar62._4_4_;
              auVar97._0_4_ = auVar62._4_4_;
              auVar97._8_4_ = auVar62._12_4_;
              auVar97._12_4_ = auVar62._12_4_;
              auVar60 = pshuflw(auVar62,auVar97,0xe8);
              auVar98._4_4_ = auVar82._4_4_;
              auVar98._0_4_ = auVar82._4_4_;
              auVar98._8_4_ = auVar82._12_4_;
              auVar98._12_4_ = auVar82._12_4_;
              auVar89 = pshuflw(auVar82,auVar98,0xe8);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 & auVar93,(auVar89 | auVar60 & auVar93) ^ auVar5);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0x8b + lVar49) = 1;
              }
              auVar16._4_4_ = auVar82._0_4_;
              auVar16._0_4_ = auVar82._0_4_;
              auVar16._8_4_ = auVar82._8_4_;
              auVar16._12_4_ = auVar82._8_4_;
              auVar98 = auVar97 & auVar16 | auVar98;
              auVar89 = packssdw(auVar98,auVar98);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60,auVar89 ^ auVar6);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._4_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0xab + lVar49) = 1;
              }
              auVar60 = auVar76 ^ auVar26;
              auVar83._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar83._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar83._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar83._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar99._4_4_ = auVar83._0_4_;
              auVar99._0_4_ = auVar83._0_4_;
              auVar99._8_4_ = auVar83._8_4_;
              auVar99._12_4_ = auVar83._8_4_;
              iVar106 = -(uint)(auVar60._4_4_ == iVar69);
              iVar110 = -(uint)(auVar60._12_4_ == iVar92);
              auVar17._4_4_ = iVar106;
              auVar17._0_4_ = iVar106;
              auVar17._8_4_ = iVar110;
              auVar17._12_4_ = iVar110;
              auVar108._4_4_ = auVar83._4_4_;
              auVar108._0_4_ = auVar83._4_4_;
              auVar108._8_4_ = auVar83._12_4_;
              auVar108._12_4_ = auVar83._12_4_;
              auVar60 = auVar17 & auVar99 | auVar108;
              auVar60 = packssdw(auVar60,auVar60);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar7,auVar60 ^ auVar7);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0xcb + lVar49) = 1;
              }
              auVar60 = pshufhw(auVar60,auVar99,0x84);
              auVar18._4_4_ = iVar106;
              auVar18._0_4_ = iVar106;
              auVar18._8_4_ = iVar110;
              auVar18._12_4_ = iVar110;
              auVar93 = pshufhw(auVar83,auVar18,0x84);
              auVar89 = pshufhw(auVar60,auVar108,0x84);
              auVar63._8_4_ = 0xffffffff;
              auVar63._0_8_ = 0xffffffffffffffff;
              auVar63._12_4_ = 0xffffffff;
              auVar63 = (auVar89 | auVar93 & auVar60) ^ auVar63;
              auVar60 = packssdw(auVar63,auVar63);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._6_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0xeb + lVar49) = 1;
              }
              auVar60 = auVar75 ^ auVar26;
              auVar84._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar84._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar84._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar84._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar19._4_4_ = auVar84._0_4_;
              auVar19._0_4_ = auVar84._0_4_;
              auVar19._8_4_ = auVar84._8_4_;
              auVar19._12_4_ = auVar84._8_4_;
              auVar93 = pshuflw(auVar108,auVar19,0xe8);
              auVar64._0_4_ = -(uint)(auVar60._0_4_ == iVar44);
              auVar64._4_4_ = -(uint)(auVar60._4_4_ == iVar69);
              auVar64._8_4_ = -(uint)(auVar60._8_4_ == iVar91);
              auVar64._12_4_ = -(uint)(auVar60._12_4_ == iVar92);
              auVar100._4_4_ = auVar64._4_4_;
              auVar100._0_4_ = auVar64._4_4_;
              auVar100._8_4_ = auVar64._12_4_;
              auVar100._12_4_ = auVar64._12_4_;
              auVar60 = pshuflw(auVar64,auVar100,0xe8);
              auVar101._4_4_ = auVar84._4_4_;
              auVar101._0_4_ = auVar84._4_4_;
              auVar101._8_4_ = auVar84._12_4_;
              auVar101._12_4_ = auVar84._12_4_;
              auVar89 = pshuflw(auVar84,auVar101,0xe8);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar89 | auVar60 & auVar93) ^ auVar85;
              auVar89 = packssdw(auVar85,auVar85);
              auVar60 = packsswb(auVar60 & auVar93,auVar89);
              if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0x10b + lVar49) = 1;
              }
              auVar20._4_4_ = auVar84._0_4_;
              auVar20._0_4_ = auVar84._0_4_;
              auVar20._8_4_ = auVar84._8_4_;
              auVar20._12_4_ = auVar84._8_4_;
              auVar101 = auVar100 & auVar20 | auVar101;
              auVar89 = packssdw(auVar101,auVar101);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar89 = packssdw(auVar89 ^ auVar8,auVar89 ^ auVar8);
              auVar60 = packsswb(auVar60,auVar89);
              if ((auVar60._8_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 299 + lVar49) = 1;
              }
              auVar60 = auVar74 ^ auVar26;
              auVar86._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar86._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar86._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar86._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar102._4_4_ = auVar86._0_4_;
              auVar102._0_4_ = auVar86._0_4_;
              auVar102._8_4_ = auVar86._8_4_;
              auVar102._12_4_ = auVar86._8_4_;
              iVar106 = -(uint)(auVar60._4_4_ == iVar69);
              iVar110 = -(uint)(auVar60._12_4_ == iVar92);
              auVar21._4_4_ = iVar106;
              auVar21._0_4_ = iVar106;
              auVar21._8_4_ = iVar110;
              auVar21._12_4_ = iVar110;
              auVar109._4_4_ = auVar86._4_4_;
              auVar109._0_4_ = auVar86._4_4_;
              auVar109._8_4_ = auVar86._12_4_;
              auVar109._12_4_ = auVar86._12_4_;
              auVar60 = auVar21 & auVar102 | auVar109;
              auVar60 = packssdw(auVar60,auVar60);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar9,auVar60 ^ auVar9);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0x14b + lVar49) = 1;
              }
              auVar60 = pshufhw(auVar60,auVar102,0x84);
              auVar22._4_4_ = iVar106;
              auVar22._0_4_ = iVar106;
              auVar22._8_4_ = iVar110;
              auVar22._12_4_ = iVar110;
              auVar93 = pshufhw(auVar86,auVar22,0x84);
              auVar89 = pshufhw(auVar60,auVar109,0x84);
              auVar65._8_4_ = 0xffffffff;
              auVar65._0_8_ = 0xffffffffffffffff;
              auVar65._12_4_ = 0xffffffff;
              auVar65 = (auVar89 | auVar93 & auVar60) ^ auVar65;
              auVar60 = packssdw(auVar65,auVar65);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._10_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x16b + lVar49) = 1;
              }
              auVar60 = auVar72 ^ auVar26;
              auVar87._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar87._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar87._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar87._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar23._4_4_ = auVar87._0_4_;
              auVar23._0_4_ = auVar87._0_4_;
              auVar23._8_4_ = auVar87._8_4_;
              auVar23._12_4_ = auVar87._8_4_;
              auVar93 = pshuflw(auVar109,auVar23,0xe8);
              auVar66._0_4_ = -(uint)(auVar60._0_4_ == iVar44);
              auVar66._4_4_ = -(uint)(auVar60._4_4_ == iVar69);
              auVar66._8_4_ = -(uint)(auVar60._8_4_ == iVar91);
              auVar66._12_4_ = -(uint)(auVar60._12_4_ == iVar92);
              auVar103._4_4_ = auVar66._4_4_;
              auVar103._0_4_ = auVar66._4_4_;
              auVar103._8_4_ = auVar66._12_4_;
              auVar103._12_4_ = auVar66._12_4_;
              auVar60 = pshuflw(auVar66,auVar103,0xe8);
              auVar104._4_4_ = auVar87._4_4_;
              auVar104._0_4_ = auVar87._4_4_;
              auVar104._8_4_ = auVar87._12_4_;
              auVar104._12_4_ = auVar87._12_4_;
              auVar89 = pshuflw(auVar87,auVar104,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 & auVar93,(auVar89 | auVar60 & auVar93) ^ auVar10);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0x18b + lVar49) = 1;
              }
              auVar24._4_4_ = auVar87._0_4_;
              auVar24._0_4_ = auVar87._0_4_;
              auVar24._8_4_ = auVar87._8_4_;
              auVar24._12_4_ = auVar87._8_4_;
              auVar104 = auVar103 & auVar24 | auVar104;
              auVar89 = packssdw(auVar104,auVar104);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60,auVar89 ^ auVar11);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._12_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x1ab + lVar49) = 1;
              }
              auVar60 = auVar70 ^ auVar26;
              auVar88._0_4_ = -(uint)(iVar44 < auVar60._0_4_);
              auVar88._4_4_ = -(uint)(iVar69 < auVar60._4_4_);
              auVar88._8_4_ = -(uint)(iVar91 < auVar60._8_4_);
              auVar88._12_4_ = -(uint)(iVar92 < auVar60._12_4_);
              auVar105._4_4_ = auVar88._0_4_;
              auVar105._0_4_ = auVar88._0_4_;
              auVar105._8_4_ = auVar88._8_4_;
              auVar105._12_4_ = auVar88._8_4_;
              iVar44 = -(uint)(auVar60._4_4_ == iVar69);
              iVar69 = -(uint)(auVar60._12_4_ == iVar92);
              auVar90._4_4_ = iVar44;
              auVar90._0_4_ = iVar44;
              auVar90._8_4_ = iVar69;
              auVar90._12_4_ = iVar69;
              auVar67._4_4_ = auVar88._4_4_;
              auVar67._0_4_ = auVar88._4_4_;
              auVar67._8_4_ = auVar88._12_4_;
              auVar67._12_4_ = auVar88._12_4_;
              auVar67 = auVar90 & auVar105 | auVar67;
              auVar60 = packssdw(auVar67,auVar67);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar12,auVar60 ^ auVar12);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar46 + 0x1cb + lVar49) = 1;
              }
              auVar60 = pshufhw(auVar60,auVar105,0x84);
              in_XMM11 = pshufhw(auVar88,auVar90,0x84);
              in_XMM11 = in_XMM11 & auVar60;
              auVar25._4_4_ = auVar88._4_4_;
              auVar25._0_4_ = auVar88._4_4_;
              auVar25._8_4_ = auVar88._12_4_;
              auVar25._12_4_ = auVar88._12_4_;
              auVar60 = pshufhw(auVar60,auVar25,0x84);
              auVar68._8_4_ = 0xffffffff;
              auVar68._0_8_ = 0xffffffffffffffff;
              auVar68._12_4_ = 0xffffffff;
              auVar68 = (auVar60 | in_XMM11) ^ auVar68;
              auVar60 = packssdw(auVar68,auVar68);
              auVar60 = packsswb(auVar60,auVar60);
              if ((auVar60._14_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar46 + 0x1eb + lVar49) = 1;
              }
              lVar52 = (long)DAT_001fe2a0;
              lVar71 = auVar79._8_8_;
              auVar79._0_8_ = auVar79._0_8_ + lVar52;
              lVar41 = DAT_001fe2a0._8_8_;
              auVar79._8_8_ = lVar71 + lVar41;
              lVar71 = auVar78._8_8_;
              auVar78._0_8_ = auVar78._0_8_ + lVar52;
              auVar78._8_8_ = lVar71 + lVar41;
              lVar71 = auVar77._8_8_;
              auVar77._0_8_ = auVar77._0_8_ + lVar52;
              auVar77._8_8_ = lVar71 + lVar41;
              lVar71 = auVar76._8_8_;
              auVar76._0_8_ = auVar76._0_8_ + lVar52;
              auVar76._8_8_ = lVar71 + lVar41;
              lVar71 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + lVar52;
              auVar75._8_8_ = lVar71 + lVar41;
              lVar71 = auVar74._8_8_;
              auVar74._0_8_ = auVar74._0_8_ + lVar52;
              auVar74._8_8_ = lVar71 + lVar41;
              lVar71 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + lVar52;
              auVar72._8_8_ = lVar71 + lVar41;
              lVar71 = auVar70._8_8_;
              auVar70._0_8_ = auVar70._0_8_ + lVar52;
              auVar70._8_8_ = lVar71 + lVar41;
              lVar49 = lVar49 + 0x200;
              auVar60 = _DAT_001fe2a0;
            } while ((ulong)(uVar40 >> 4) << 9 != lVar49);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_60 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar49 = 8;
        lVar46 = 0;
        do {
          lVar52 = DAT_00274260;
          if (lVar46 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar50 = (undefined8 *)(lVar49 + lVar52 + -8);
          PushID(puVar50);
          bVar27 = Checkbox((char *)*puVar50,(bool *)(lVar49 + lVar52));
          if ((bVar27) && (*(bool *)(lVar49 + lVar52) == false)) {
            *(undefined1 *)(lVar52 + lVar49) = 0;
            *(undefined1 *)(lVar52 + 2 + lVar49) = 0;
          }
          PopID();
          lVar46 = lVar46 + 1;
          lVar49 = lVar49 + 0x20;
        } while (lVar46 < ShowExampleAppDocuments(bool*)::app);
      }
      fVar54 = GetFontSize();
      PushItemWidth(fVar54 * 12.0);
      pcVar48 = "Output";
      Combo("Output",&ShowExampleAppDocuments(bool*)::opt_target,"None",-1);
      PopItemWidth();
      if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
        SameLine(0.0,-1.0);
        pcVar48 = "Reorderable Tabs";
        Checkbox("Reorderable Tabs",(bool *)&ShowExampleAppDocuments(bool*)::opt_reorderable);
      }
      cond = 4;
      if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        pcVar48 = "Redock all";
        bVar27 = Button("Redock all",(ImVec2 *)local_e8);
        cond = (uint)!bVar27 + (uint)!bVar27 * 2 + 1;
      }
      Separator();
      if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
        pIVar36 = GetIO();
        if ((pIVar36->ConfigFlags & 0x40) == 0) {
          ShowDockingDisabledMessage();
        }
        else {
          NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar48);
          IVar30 = GetID("MyDockSpace");
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          DockSpace(IVar30,(ImVec2 *)local_e8,0,(ImGuiWindowClass *)0x0);
          if (0 < ShowExampleAppDocuments(bool*)::app) {
            lVar52 = 8;
            lVar49 = 0;
            lVar46 = DAT_00274260;
            iVar44 = ShowExampleAppDocuments(bool*)::app;
            do {
              if (*(char *)(lVar46 + lVar52) == '\x01') {
                SetNextWindowDockID(IVar30,cond);
                bVar27 = Begin(*(char **)(lVar46 + -8 + lVar52),(bool *)(lVar46 + lVar52),
                               (uint)*(byte *)(lVar46 + 2 + lVar52) << 0x14);
                if ((*(char *)(lVar46 + lVar52) == '\0') &&
                   (*(char *)(lVar46 + 2 + lVar52) == '\x01')) {
                  *(undefined1 *)(lVar46 + lVar52) = 1;
                  *(undefined1 *)(lVar46 + 3 + lVar52) = 1;
                }
                pMVar51 = (MyDocument *)(lVar46 + lVar52 + -8);
                MyDocument::DisplayContextMenu(pMVar51);
                if (bVar27) {
                  MyDocument::DisplayContents(pMVar51);
                }
                End();
                lVar46 = DAT_00274260;
                iVar44 = ShowExampleAppDocuments(bool*)::app;
              }
              lVar49 = lVar49 + 1;
              lVar52 = lVar52 + 0x20;
            } while (lVar49 < iVar44);
          }
        }
      }
      else if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
        pcVar48 = "##tabs";
        bVar27 = BeginTabBar("##tabs",ShowExampleAppDocuments(bool*)::opt_reorderable | 0x40);
        if (bVar27) {
          if (ShowExampleAppDocuments(bool*)::opt_reorderable == 1) {
            NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar48);
          }
          if (0 < ShowExampleAppDocuments(bool*)::app) {
            lVar49 = 8;
            lVar46 = 0;
            do {
              lVar52 = DAT_00274260;
              if (*(char *)(DAT_00274260 + lVar49) == '\x01') {
                bVar27 = BeginTabItem(*(char **)(DAT_00274260 + -8 + lVar49),
                                      (bool *)(DAT_00274260 + lVar49),
                                      (uint)*(byte *)(DAT_00274260 + 2 + lVar49));
                if ((*(char *)(lVar52 + lVar49) == '\0') &&
                   (*(char *)(lVar52 + 2 + lVar49) == '\x01')) {
                  *(undefined1 *)(lVar52 + lVar49) = 1;
                  *(undefined1 *)(lVar52 + 3 + lVar49) = 1;
                }
                pMVar51 = (MyDocument *)(lVar52 + lVar49 + -8);
                MyDocument::DisplayContextMenu(pMVar51);
                if (bVar27) {
                  MyDocument::DisplayContents(pMVar51);
                  EndTabItem();
                }
              }
              lVar46 = lVar46 + 1;
              lVar49 = lVar49 + 0x20;
            } while (lVar46 < ShowExampleAppDocuments(bool*)::app);
          }
          EndTabBar();
        }
      }
      p_open = local_60;
      if (local_138[0] != '\0') {
        if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
          ShowDemoWindow();
        }
        uVar73 = _close_queue & 0xffffffff;
        if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
          if (0 < ShowExampleAppDocuments(bool*)::app) {
            lVar52 = 0;
            uVar73 = 0;
            lVar49 = 0;
            lVar46 = DAT_00274260;
            iVar44 = ShowExampleAppDocuments(bool*)::app;
            do {
              iVar69 = (int)uVar73;
              if (*(char *)(lVar46 + 0xb + lVar52) == '\x01') {
                *(undefined1 *)(lVar46 + 0xb + lVar52) = 0;
                if (iVar69 == DAT_00274274) {
                  if (iVar69 == 0) {
                    iVar44 = 8;
                  }
                  else {
                    iVar44 = ((int)(uVar73 >> 0x1f) + iVar69 >> 1) + iVar69;
                  }
                  iVar91 = iVar69 + 1;
                  if (iVar69 + 1 < iVar44) {
                    iVar91 = iVar44;
                  }
                  pvVar39 = MemAlloc((long)iVar91 << 3);
                  if (DAT_00274278 != (void *)0x0) {
                    memcpy(pvVar39,DAT_00274278,
                           (long)ShowExampleAppDocuments(bool*)::close_queue << 3);
                    MemFree(DAT_00274278);
                  }
                  _close_queue = CONCAT44(iVar91,ShowExampleAppDocuments(bool*)::close_queue);
                  iVar69 = ShowExampleAppDocuments(bool*)::close_queue;
                  DAT_00274278 = pvVar39;
                }
                *(long *)((long)DAT_00274278 + (long)iVar69 * 8) = lVar46 + lVar52;
                uVar73 = (ulong)(ShowExampleAppDocuments(bool*)::close_queue + 1U);
                _close_queue = CONCAT44(DAT_00274274,
                                        ShowExampleAppDocuments(bool*)::close_queue + 1U);
                lVar46 = DAT_00274260;
                iVar44 = ShowExampleAppDocuments(bool*)::app;
              }
              lVar49 = lVar49 + 1;
              lVar52 = lVar52 + 0x20;
            } while (lVar49 < iVar44);
            if ((int)uVar73 != 0) goto LAB_001abdf8;
          }
        }
        else {
LAB_001abdf8:
          pvVar39 = DAT_00274278;
          if ((int)uVar73 < 1) {
            if (DAT_00274278 != (void *)0x0) goto LAB_001ac083;
          }
          else {
            uVar42 = 0;
            iVar44 = 0;
            do {
              iVar44 = iVar44 + (uint)*(byte *)(*(long *)((long)DAT_00274278 + uVar42 * 8) + 10);
              uVar42 = uVar42 + 1;
            } while (uVar73 != uVar42);
            if (iVar44 == 0) {
              uVar42 = 0;
              do {
                lVar46 = *(long *)((long)pvVar39 + uVar42 * 8);
                *(undefined1 *)(lVar46 + 8) = 0;
                *(undefined1 *)(lVar46 + 10) = 0;
                uVar42 = uVar42 + 1;
              } while (uVar73 != uVar42);
LAB_001ac083:
              _close_queue = 0;
              MemFree(pvVar39);
              DAT_00274278 = (void *)0x0;
            }
            else {
              bVar27 = IsPopupOpen("Save?",0);
              if (!bVar27) {
                OpenPopup("Save?",0);
              }
              bVar27 = BeginPopupModal("Save?",(bool *)0x0,0x40);
              if (!bVar27) goto LAB_001ac181;
              Text("Save change to the following items?");
              fVar54 = GetTextLineHeightWithSpacing();
              IVar30 = GetID("frame");
              local_e8._4_4_ = fVar54 * 6.25;
              local_e8._0_4_ = -1.1754944e-38;
              bVar27 = BeginChildFrame(IVar30,(ImVec2 *)local_e8,0);
              if (bVar27) {
                if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                  lVar46 = 0;
                  pvVar39 = DAT_00274278;
                  iVar44 = ShowExampleAppDocuments(bool*)::close_queue;
                  do {
                    puVar50 = *(undefined8 **)((long)pvVar39 + lVar46 * 8);
                    if (*(char *)((long)puVar50 + 10) == '\x01') {
                      Text("%s",*puVar50);
                      pvVar39 = DAT_00274278;
                      iVar44 = ShowExampleAppDocuments(bool*)::close_queue;
                    }
                    lVar46 = lVar46 + 1;
                  } while (lVar46 < iVar44);
                }
                EndChildFrame();
              }
              fVar54 = GetFontSize();
              local_e8._4_4_ = 0;
              local_e8._0_4_ = fVar54 * 7.0;
              bVar27 = Button("Yes",(ImVec2 *)local_e8);
              pvVar39 = DAT_00274278;
              if (bVar27) {
                if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                  if (DAT_00274278 != (void *)0x0) goto LAB_001ac0a2;
                }
                else {
                  lVar46 = 0;
                  do {
                    lVar49 = *(long *)((long)pvVar39 + lVar46 * 8);
                    if (*(char *)(lVar49 + 10) == '\x01') {
                      *(undefined1 *)(lVar49 + 10) = 0;
                    }
                    *(undefined1 *)(lVar49 + 8) = 0;
                    *(undefined1 *)(lVar49 + 10) = 0;
                    lVar46 = lVar46 + 1;
                  } while (ShowExampleAppDocuments(bool*)::close_queue != lVar46);
LAB_001ac0a2:
                  _close_queue = 0;
                  MemFree(pvVar39);
                  DAT_00274278 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              SameLine(0.0,-1.0);
              bVar27 = Button("No",(ImVec2 *)local_e8);
              pvVar39 = DAT_00274278;
              if (bVar27) {
                if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                  if (DAT_00274278 != (void *)0x0) goto LAB_001ac114;
                }
                else {
                  lVar46 = 0;
                  do {
                    lVar49 = *(long *)((long)pvVar39 + lVar46 * 8);
                    *(undefined1 *)(lVar49 + 8) = 0;
                    *(undefined1 *)(lVar49 + 10) = 0;
                    lVar46 = lVar46 + 1;
                  } while (ShowExampleAppDocuments(bool*)::close_queue != lVar46);
LAB_001ac114:
                  _close_queue = 0;
                  MemFree(pvVar39);
                  DAT_00274278 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              SameLine(0.0,-1.0);
              bVar27 = Button("Cancel",(ImVec2 *)local_e8);
              if (bVar27) {
                if (DAT_00274278 != (void *)0x0) {
                  _close_queue = 0;
                  MemFree(DAT_00274278);
                  DAT_00274278 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              EndPopup();
            }
          }
        }
      }
    }
LAB_001ac181:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar44 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar44 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_60 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar44 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar44 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar27 = SmallButton("[Debug] Add 5 entries");
    if (bVar27) {
      iVar44 = 5;
      do {
        uVar40 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar40
                  );
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar44 = iVar44 + -1;
      } while (iVar44 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_60;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    bVar27 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar27) {
      bVar27 = BeginMenuBar();
      if (bVar27) {
        bVar27 = BeginMenu("File",true);
        if (bVar27) {
          bVar27 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar27) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_e8._0_4_ = 150.0;
      local_e8._4_4_ = 0.0;
      BeginChild("left pane",(ImVec2 *)local_e8,true,0);
      uVar73 = 0;
      do {
        iVar44 = (int)uVar73;
        sprintf((char *)local_e8,"MyObject %d",uVar73);
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar27 = Selectable((char *)local_e8,iVar44 == ShowExampleAppLayout(bool*)::selected,0,
                            &local_158);
        if (bVar27) {
          ShowExampleAppLayout(bool*)::selected = iVar44;
        }
        uVar73 = (ulong)(iVar44 + 1U);
      } while (iVar44 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar54 = GetFrameHeightWithSpacing();
      local_e8 = (undefined1  [8])((ulong)(uint)fVar54 << 0x20 ^ 0x8000000000000000);
      BeginChild("item view",(ImVec2 *)local_e8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar27 = BeginTabBar("##Tabs",0);
      if (bVar27) {
        bVar27 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar27) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar27 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar27) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_e8);
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_e8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_e8._0_4_ = 430.0;
    local_e8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    bVar27 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar27) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_e8._0_4_ = 2.0;
      local_e8._4_4_ = 2.0;
      PushStyleVar(0xb,(ImVec2 *)local_e8);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar27 = BeginTable("split",2,0x501,(ImVec2 *)local_e8,0.0);
      if (bVar27) {
        iVar44 = 0;
        do {
          ShowPlaceholderObject("Object",iVar44);
          iVar44 = iVar44 + 1;
        } while (iVar44 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_e8._0_4_ = 520.0;
    local_e8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    bVar27 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar27) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar73 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar73 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar73)
      ;
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar27 = Button("Clear",(ImVec2 *)local_e8);
      if (bVar27) {
        if (DAT_002741e0 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_002741e0);
          DAT_002741e0 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar27 = Button("Add 1000 lines",(ImVec2 *)local_e8);
      if (bVar27) {
        iVar44 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar44));
          iVar44 = iVar44 + 1;
        } while (iVar44 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_e8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_e8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          iVar44 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog");
            iVar44 = iVar44 + 1;
          } while (iVar44 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_e8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_e8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_e8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar27 = ImGuiListClipper::Step((ImGuiListClipper *)local_e8), bVar27) {
          for (fVar54 = (float)local_e8._0_4_; (int)fVar54 < (int)local_e8._4_4_;
              fVar54 = (float)((int)fVar54 + 1)) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_e8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        if (DAT_002741e0 == (char *)0x0) {
          pcVar48 = ImGuiTextBuffer::EmptyString;
          pcVar47 = ImGuiTextBuffer::EmptyString;
        }
        else {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                          ,0x70e,"const T &ImVector<char>::front() const [T = char]");
          }
          pcVar47 = DAT_002741e0 + (long)ShowExampleAppLongText(bool*)::log + -1;
          pcVar48 = DAT_002741e0;
        }
        TextUnformatted(pcVar48,pcVar47);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar27 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar27) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar73 = 0;
        iVar44 = 0;
        do {
          Text("%*sThis is line %d",uVar73,"");
          iVar44 = iVar44 + 1;
          uVar73 = (ulong)((int)uVar73 + 4);
        } while (iVar44 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_b8 = "Custom: Fixed Steps (100)";
    local_c8 = "Height 400-500";
    pcStack_c0 = "Custom: Always Square";
    local_d8 = (ImVec2)0x2246ab;
    IStack_d0 = (ImVec2)0x2246c5;
    local_e8 = (undefined1  [8])0x22467f;
    IStack_e0 = (ImVec2)0x224694;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_158.x = -1.0;
      local_158.y = 0.0;
      local_120.x = -1.0;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_158.x = 0.0;
      local_158.y = -1.0;
      local_120.x = 3.4028235e+38;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_158.x = 100.0;
      local_158.y = 100.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_158.x = 400.0;
      local_158.y = -1.0;
      local_120.x = 500.0;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_158.x = -1.0;
      local_158.y = 400.0;
      local_120.x = -1.0;
      local_120.y = 500.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar27 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                   (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar27) {
      bVar27 = IsWindowDocked();
      if (bVar27) {
        Text("Warning: Sizing Constraints won\'t work if the window is docked!");
      }
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("200x200",&local_158);
      if (bVar27) {
        local_158.x = 200.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("500x500",&local_158);
      if (bVar27) {
        local_158.x = 500.0;
        local_158.y = 500.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("800x200",&local_158);
      if (bVar27) {
        local_158.x = 800.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_e8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar73 = 0;
        iVar44 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar73,"");
          iVar44 = iVar44 + 1;
          uVar73 = (ulong)((int)uVar73 + 4);
        } while (iVar44 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar36 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0x2c116b;
    }
    else {
      pIVar35 = GetMainViewport();
      uVar40 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0);
      uVar43 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0);
      fVar54 = (pIVar35->WorkPos).x;
      fVar56 = (pIVar35->WorkPos).y;
      local_e8 = (undefined1  [8])
                 (CONCAT44(~uVar43 & (uint)((pIVar35->WorkSize).y + fVar56 + -10.0),
                           ~uVar40 & (uint)((pIVar35->WorkSize).x + fVar54 + -10.0)) |
                 CONCAT44((uint)(fVar56 + 10.0) & uVar43,(uint)(fVar54 + 10.0) & uVar40));
      uVar73 = ~CONCAT44(uVar43,uVar40) & DAT_001ff530;
      local_158.x = (float)uVar73;
      local_158.y = (float)(uVar73 >> 0x20);
      SetNextWindowPos((ImVec2 *)local_e8,1,&local_158);
      SetNextWindowViewport(pIVar35->ID);
      flags = 0x2c116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar27 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar27) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar27 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar27) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar36->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar27 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar27) {
        bVar27 = MenuItem("Custom",(char *)0x0,
                          ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar40 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar27 = MenuItem("Top-left",(char *)0x0,!bVar27 && uVar40 == 0,true);
        uVar40 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar27 = MenuItem("Top-right",(char *)0x0,!bVar27 && uVar40 == 1,true);
        uVar40 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar27 = MenuItem("Bottom-left",(char *)0x0,!bVar27 && uVar40 == 2,true);
        uVar40 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar27 = MenuItem("Bottom-right",(char *)0x0,!bVar27 && uVar40 == 3,true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar27 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar27) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar35 = GetMainViewport();
    local_e8._0_4_ = 0.0;
    local_e8._4_4_ = 0.0;
    SetNextWindowPos(&pIVar35->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)local_e8);
    SetNextWindowSize(&pIVar35->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    bVar27 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                   ShowExampleAppFullscreen(bool*)::flags);
    if (bVar27) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar27 = Button("Close this window",(ImVec2 *)local_e8);
      if (bVar27) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar35 = GetMainViewport();
    local_138._0_4_ = (pIVar35->Pos).x + 100.0;
    fVar54 = (pIVar35->Pos).y;
    local_138._4_4_ = fVar54 + 100.0;
    uStack_130 = 0;
    local_e8._4_4_ = fVar54 + 100.0;
    local_e8._0_4_ = local_138._0_4_;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_e8._4_4_ = fVar54 + 200.0;
    local_e8._0_4_ = local_138._0_4_;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar57 = GetTime();
    cVar2 = "|/-\\"[(int)(dVar57 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_e8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar2);
    local_158.y = fVar54 + 300.0;
    local_158.x = (float)local_138._0_4_;
    local_120.x = 0.0;
    local_120.y = 0.0;
    SetNextWindowPos(&local_158,4,&local_120);
    Begin(local_e8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_001ae5f7;
  bVar27 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if ((bVar27) && (bVar27 = BeginTabBar("##TabBar",0), bVar27)) {
    bVar27 = BeginTabItem("Primitives",(bool *)0x0,0);
    if (bVar27) {
      local_60 = p_open;
      fVar54 = GetFontSize();
      PushItemWidth(fVar54 * -15.0);
      pIVar37 = GetWindowDrawList();
      Text("Gradients");
      fVar54 = CalcItemWidth();
      local_138._0_4_ = GetFrameHeight();
      local_138._4_4_ = extraout_XMM0_Db;
      uStack_130._0_4_ = extraout_XMM0_Dc;
      uStack_130._4_4_ = extraout_XMM0_Dd;
      local_120.y = (float)local_138._0_4_;
      local_120.x = fVar54;
      local_e8 = (undefined1  [8])GetCursorScreenPos();
      local_158.x = fVar54 + local_e8._0_4_;
      local_158.y = (float)local_138._0_4_ + local_e8._4_4_;
      IVar31 = GetColorU32(0xff000000);
      IVar32 = GetColorU32(0xffffffff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,IVar32,IVar32,IVar31);
      InvisibleButton("##gradient1",&local_120,0);
      local_e8 = (undefined1  [8])GetCursorScreenPos();
      local_158.x = local_120.x + local_e8._0_4_;
      local_158.y = local_120.y + local_e8._4_4_;
      IVar31 = GetColorU32(0xff00ff00);
      IVar32 = GetColorU32(0xff0000ff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,IVar32,IVar32,IVar31);
      InvisibleButton("##gradient2",&local_120,0);
      Text("All primitives");
      if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
        ShowDemoWindow();
      }
      DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
      DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",0)
      ;
      SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
      Checkbox("##circlesegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
      pIVar38 = GetStyle();
      SameLine(0.0,(pIVar38->ItemInnerSpacing).x);
      bVar27 = SliderInt("Circle segments override",
                         &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                         "%d",0);
      ShowExampleAppCustomRendering(bool*)::circle_segments_override =
           ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar27;
      Checkbox("##curvessegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
      pIVar38 = GetStyle();
      SameLine(0.0,(pIVar38->ItemInnerSpacing).x);
      bVar27 = SliderInt("Curves segments override",
                         &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                         "%d",0);
      ShowExampleAppCustomRendering(bool*)::curve_segments_override =
           ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar27;
      ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
      IVar58 = GetCursorScreenPos();
      local_e8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
      IStack_e0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
      IStack_e0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
      IVar31 = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
      local_ec = 0;
      if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
        local_ec = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
      }
      iVar44 = 0;
      if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
        iVar44 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
      }
      local_4c = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
      local_168 = IVar58.x;
      fStack_164 = IVar58.y;
      uStack_15c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
      local_48.x = local_168 + 4.0;
      local_48.y = fStack_164;
      uStack_40._0_4_ = (undefined4)extraout_XMM0_Qb;
      uStack_40._4_4_ = uStack_15c;
      fVar54 = fStack_164 + 4.0;
      bVar27 = true;
      do {
        bVar28 = bVar27;
        fVar56 = 1.0;
        if (!bVar28) {
          fVar56 = ShowExampleAppCustomRendering(bool*)::thickness;
        }
        local_138._0_4_ = fVar56;
        fVar55 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_e8._0_4_ = fVar55 + local_48.x;
        local_e8._4_4_ = fVar55 + fVar54;
        ImDrawList::AddNgon(pIVar37,(ImVec2 *)local_e8,fVar55,IVar31,
                            ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar56);
        fVar55 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
        _local_118 = ZEXT416((uint)fVar55);
        fVar56 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_e8._0_4_ = fVar56 + fVar55;
        local_e8._4_4_ = fVar56 + fVar54;
        ImDrawList::AddCircle
                  (pIVar37,(ImVec2 *)local_e8,fVar56,IVar31,local_ec,(float)local_138._0_4_);
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        _local_118 = ZEXT416((uint)local_e8._0_4_);
        local_e8._4_4_ = fVar54;
        local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,0.0,0,
                            (float)local_138._0_4_);
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        _local_118 = ZEXT416((uint)local_e8._0_4_);
        local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,local_4c,0,
                            (float)local_138._0_4_);
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        _local_118 = ZEXT416((uint)local_e8._0_4_);
        local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,local_4c,0x90,
                            (float)local_138._0_4_);
        local_118._0_4_ = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar54 + -0.5;
        local_118._4_4_ = local_158.y;
        uStack_110._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
        uStack_110._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_164 + 0.0;
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_118._0_4_;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
        local_58.y = local_158.y;
        local_58.x = (float)local_118._0_4_;
        ImDrawList::AddTriangle
                  (pIVar37,(ImVec2 *)local_e8,&local_158,&local_58,IVar31,(float)local_138._0_4_);
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        _local_118 = ZEXT416((uint)local_e8._0_4_);
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
        local_158.y = fVar54;
        ImDrawList::AddLine(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,(float)local_138._0_4_);
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar54;
        uStack_110._0_4_ = (float)local_118._4_4_ + 0.0;
        local_118._4_4_ = local_158.y;
        local_118._0_4_ = local_158.x;
        uStack_110._4_4_ = fStack_164 + 0.0;
        local_e8._0_4_ = local_158.x;
        ImDrawList::AddLine(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,(float)local_138._0_4_);
        local_118._0_4_ = (float)local_118._0_4_ + 10.0;
        local_e8._0_4_ = local_118._0_4_;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar54;
        ImDrawList::AddLine(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,(float)local_138._0_4_);
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        _local_118 = ZEXT416((uint)local_158.x);
        local_150.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar54;
        local_148[0].x = local_158.x + ShowExampleAppCustomRendering(bool*)::sz;
        local_148[0].y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar54;
        local_150.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_158.x;
        ImDrawList::AddBezierQuadratic
                  (pIVar37,&local_158,&local_150,local_148,IVar31,(float)local_138._0_4_,iVar44);
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
        IStack_e0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar54;
        IStack_e0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_e8._0_4_;
        local_d8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                     fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        local_d8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                     ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
        IStack_d0.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
        IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
        ImDrawList::AddBezierCubic
                  (pIVar37,(ImVec2 *)local_e8,&IStack_e0,&local_d8,&IStack_d0,IVar31,
                   (float)local_138._0_4_,iVar44);
        fVar54 = fVar54 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        bVar27 = false;
      } while (bVar28);
      fVar56 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      local_e8._0_4_ = fVar56 + local_48.x;
      local_e8._4_4_ = fVar56 + fVar54;
      ImDrawList::AddNgonFilled
                (pIVar37,(ImVec2 *)local_e8,fVar56,IVar31,
                 ShowExampleAppCustomRendering(bool*)::ngon_sides);
      local_48.x = local_48.x + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      fVar56 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      local_e8._0_4_ = fVar56 + local_48.x;
      local_e8._4_4_ = fVar56 + fVar54;
      ImDrawList::AddCircleFilled(pIVar37,(ImVec2 *)local_e8,fVar56,IVar31,local_ec);
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
      _local_138 = ZEXT416((uint)local_e8._0_4_);
      local_e8._4_4_ = fVar54;
      local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,0.0,0);
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
      _local_138 = ZEXT416((uint)local_e8._0_4_);
      local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,10.0,0);
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
      _local_138 = ZEXT416((uint)local_e8._0_4_);
      local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,10.0,0x90);
      local_138._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar54 + -0.5;
      local_138._4_4_ = local_158.y;
      uStack_130._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
      uStack_130._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_164 + 0.0;
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_138._0_4_;
      local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
      local_58.y = local_158.y;
      local_58.x = (float)local_138._0_4_;
      ImDrawList::AddTriangleFilled(pIVar37,(ImVec2 *)local_e8,&local_158,&local_58,IVar31);
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
      _local_138 = ZEXT416((uint)local_e8._0_4_);
      local_158.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_158.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar54;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,0.0,0);
      local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
      _local_138 = ZEXT416((uint)local_e8._0_4_);
      local_158.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_e8._0_4_;
      local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar54;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,0.0,0);
      local_138._0_4_ = (float)local_138._0_4_ + 20.0;
      local_e8._0_4_ = local_138._0_4_;
      local_158.x = (float)local_138._0_4_ + 1.0;
      local_158.y = fVar54 + 1.0;
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_158,IVar31,0.0,0);
      local_e8._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_158.x = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                    ShowExampleAppCustomRendering(bool*)::sz;
      local_158.y = fVar54 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilledMultiColor
                (pIVar37,(ImVec2 *)local_e8,&local_158,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
      local_e8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
      local_e8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
      Dummy((ImVec2 *)local_e8);
      PopItemWidth();
      EndTabItem();
      p_open = local_60;
    }
    bVar27 = BeginTabItem("Canvas",(bool *)0x0,0);
    if (bVar27) {
      if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
        ShowDemoWindow();
      }
      if (ShowExampleAppCustomRendering(bool*)::scrolling == '\0') {
        ShowDemoWindow();
      }
      Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
      Checkbox("Enable context menu",
               (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
      Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");
      local_e8 = (undefined1  [8])GetCursorScreenPos();
      IVar58 = GetContentRegionAvail();
      local_158.x = IVar58.x;
      local_158.y = IVar58.y;
      if (local_158.x < 50.0) {
        local_158.x = 50.0;
        IVar58.x = 50.0;
        IVar58.y = 0.0;
      }
      if (local_158.y < 50.0) {
        local_158.y = 50.0;
      }
      local_120.x = local_e8._0_4_ + IVar58.x;
      local_120.y = local_e8._4_4_ + local_158.y;
      pIVar36 = GetIO();
      pIVar37 = GetWindowDrawList();
      ImDrawList::AddRectFilled(pIVar37,(ImVec2 *)local_e8,&local_120,0xff323232,0.0,0);
      ImDrawList::AddRect(pIVar37,(ImVec2 *)local_e8,&local_120,0xffffffff,0.0,0,1.0);
      InvisibleButton("canvas",&local_158,3);
      bVar27 = IsItemHovered(0);
      bVar28 = IsItemActive();
      fVar54 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + local_e8._0_4_;
      fVar56 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + local_e8._4_4_;
      local_58.x = (pIVar36->MousePos).x - fVar54;
      local_58.y = (pIVar36->MousePos).y - fVar56;
      if (bVar27) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
          bVar27 = IsMouseClicked(0,false);
          if (!bVar27) goto LAB_001ae04c;
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
LAB_001ae055:
        if ((long)(int)ShowExampleAppCustomRendering(bool*)::points < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                        ,0x70f,"T &ImVector<ImVec2>::back() [T = ImVec2]");
        }
        *(ImVec2 *)
         ((long)DAT_00274230 + (long)(int)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
             local_58;
        bVar27 = IsMouseDown(0);
        if (!bVar27) {
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        }
      }
      else {
LAB_001ae04c:
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_001ae055;
      }
      if (bVar28) {
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
          fVar55 = 0.0;
        }
        else {
          fVar55 = -1.0;
        }
        bVar27 = IsMouseDragging(1,fVar55);
        if (bVar27) {
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
               (pIVar36->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
               (pIVar36->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
        }
      }
      IVar58 = GetMouseDragDelta(1,-1.0);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
        uStack_130 = extraout_XMM0_Qb_00;
        local_138._0_4_ = IVar58.x;
        local_138._4_4_ = IVar58.y;
        bVar27 = IsMouseReleased(1);
        if ((((bVar27) && ((float)local_138._0_4_ == 0.0)) && ((float)local_138._4_4_ == 0.0)) &&
           (!NAN((float)local_138._4_4_))) {
          OpenPopupOnItemClick("context",1);
        }
      }
      bVar27 = BeginPopup("context",0);
      if (bVar27) {
        uVar40 = ShowExampleAppCustomRendering(bool*)::points;
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          uVar40 = ShowExampleAppCustomRendering(bool*)::points - 2;
          if (DAT_0027422c < (int)uVar40) {
            if (DAT_0027422c == 0) {
              uVar43 = 8;
            }
            else {
              uVar43 = DAT_0027422c / 2 + DAT_0027422c;
            }
            if ((int)uVar43 <= (int)uVar40) {
              uVar43 = uVar40;
            }
            pvVar39 = MemAlloc((long)(int)uVar43 << 3);
            if (DAT_00274230 != (void *)0x0) {
              memcpy(pvVar39,DAT_00274230,
                     (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
              MemFree(DAT_00274230);
            }
            _points = (ulong)uVar43 << 0x20;
            DAT_00274230 = pvVar39;
          }
          _points = CONCAT44(DAT_0027422c,uVar40);
        }
        ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        bVar27 = MenuItem("Remove one",(char *)0x0,false,0 < (int)uVar40);
        uVar40 = ShowExampleAppCustomRendering(bool*)::points;
        if (bVar27) {
          uVar40 = ShowExampleAppCustomRendering(bool*)::points - 2;
          if (DAT_0027422c < (int)uVar40) {
            if (DAT_0027422c == 0) {
              uVar43 = 8;
            }
            else {
              uVar43 = DAT_0027422c / 2 + DAT_0027422c;
            }
            if ((int)uVar43 <= (int)uVar40) {
              uVar43 = uVar40;
            }
            pvVar39 = MemAlloc((long)(int)uVar43 << 3);
            if (DAT_00274230 != (void *)0x0) {
              memcpy(pvVar39,DAT_00274230,
                     (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
              MemFree(DAT_00274230);
            }
            _points = (ulong)uVar43 << 0x20;
            DAT_00274230 = pvVar39;
          }
          _points = CONCAT44(DAT_0027422c,uVar40);
        }
        bVar27 = MenuItem("Remove all",(char *)0x0,false,0 < (int)uVar40);
        if ((bVar27) && (DAT_00274230 != (void *)0x0)) {
          _points = 0;
          MemFree(DAT_00274230);
          DAT_00274230 = (void *)0x0;
        }
        EndPopup();
      }
      ImDrawList::PushClipRect(pIVar37,(ImVec2)local_e8,local_120,true);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
        fVar55 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
        if (fVar55 < local_158.x) {
          do {
            local_138._0_4_ = fVar55;
            local_f8.y = (float)local_e8._4_4_;
            local_f8.x = (float)local_e8._0_4_ + fVar55;
            local_100.y = local_120.y;
            local_100.x = (float)local_e8._0_4_ + fVar55;
            ImDrawList::AddLine(pIVar37,&local_f8,&local_100,0x28c8c8c8,1.0);
            fVar55 = (float)local_138._0_4_ + 64.0;
          } while (fVar55 < local_158.x);
        }
        fVar55 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
        if (fVar55 < local_158.y) {
          do {
            local_138._0_4_ = fVar55;
            local_f8.y = (float)local_e8._4_4_ + fVar55;
            local_f8.x = local_e8._0_4_;
            local_100.y = (float)local_e8._4_4_ + fVar55;
            local_100.x = local_120.x;
            ImDrawList::AddLine(pIVar37,&local_f8,&local_100,0x28c8c8c8,1.0);
            fVar55 = (float)local_138._0_4_ + 64.0;
          } while (fVar55 < local_158.y);
        }
      }
      if (0 < (int)ShowExampleAppCustomRendering(bool*)::points) {
        lVar46 = 1;
        do {
          uVar1 = *(undefined8 *)((long)DAT_00274230 + lVar46 * 8 + -8);
          local_f8.x = (float)uVar1 + fVar54;
          local_f8.y = (float)((ulong)uVar1 >> 0x20) + fVar56;
          if ((int)ShowExampleAppCustomRendering(bool*)::points <= lVar46) {
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                          ,0x706,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
          }
          uVar1 = *(undefined8 *)((long)DAT_00274230 + lVar46 * 8);
          local_100.x = (float)uVar1 + fVar54;
          local_100.y = (float)((ulong)uVar1 >> 0x20) + fVar56;
          ImDrawList::AddLine(pIVar37,&local_f8,&local_100,0xff00ffff,2.0);
          iVar44 = (int)lVar46;
          lVar46 = lVar46 + 2;
        } while (iVar44 + 1 < (int)ShowExampleAppCustomRendering(bool*)::points);
      }
      ImDrawList::PopClipRect(pIVar37);
      EndTabItem();
    }
    bVar27 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
    if (bVar27) {
      Checkbox("Draw in Background draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
      Checkbox("Draw in Foreground draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
      IVar58 = GetWindowPos();
      uStack_130 = extraout_XMM0_Qb_01;
      local_138._0_4_ = IVar58.x;
      local_138._4_4_ = IVar58.y;
      IVar58 = GetWindowSize();
      local_e8._0_4_ = IVar58.x * 0.5 + (float)local_138._0_4_;
      local_e8._4_4_ = IVar58.y * 0.5 + (float)local_138._4_4_;
      if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
        pIVar37 = GetBackgroundDrawList();
        ImDrawList::AddCircle(pIVar37,(ImVec2 *)local_e8,IVar58.x * 0.6,0xc80000ff,0,14.0);
      }
      if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
        pIVar37 = GetForegroundDrawList();
        ImDrawList::AddCircle(pIVar37,(ImVec2 *)local_e8,IVar58.y * 0.6,0xc800ff00,0,10.0);
      }
      EndTabItem();
    }
    EndTabBar();
  }
  End();
LAB_001ae5f7:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar40 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar40 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar43 = uVar40 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar43 = uVar40;
  }
  uVar40 = uVar43 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar40 = uVar43;
  }
  uVar43 = uVar40 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar43 = uVar40;
  }
  uVar40 = uVar43 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar40 = uVar43;
  }
  uVar43 = uVar40 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar43 = uVar40;
  }
  uVar40 = uVar43 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar40 = uVar43;
  }
  uVar43 = uVar40 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar43 = uVar40;
  }
  uVar40 = uVar43 | 0x200000;
  if (ShowDemoWindow::no_docking == false) {
    uVar40 = uVar43;
  }
  uVar43 = uVar40 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar43 = uVar40;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  pIVar35 = GetMainViewport();
  local_e8._0_4_ = (pIVar35->WorkPos).x + 650.0;
  local_e8._4_4_ = (pIVar35->WorkPos).y + 20.0;
  local_158.x = 0.0;
  local_158.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
  local_e8._0_4_ = 550.0;
  local_e8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_e8,4);
  bVar27 = Begin("Dear ImGui Demo",p_open,uVar43);
  if (bVar27) {
    fVar54 = GetFontSize();
    PushItemWidth(fVar54 * -12.0);
    bVar27 = BeginMenuBar();
    if (bVar27) {
      bVar27 = BeginMenu("Menu",true);
      if (bVar27) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar27 = BeginMenu("Examples",true);
      if (bVar27) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Dockspace",(char *)0x0,&ShowDemoWindow::show_app_dockspace,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar27 = BeginMenu("Tools",true);
      if (bVar27) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar27 = CollapsingHeader("Help",0);
    if (bVar27) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar27 = CollapsingHeader("Configuration",0);
    if (bVar27) {
      pIVar36 = GetIO();
      bVar27 = TreeNode("Configuration##2");
      if (bVar27) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar36->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar36->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar36->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar36->ConfigFlags,0x10);
        if ((pIVar36->ConfigFlags & 0x10) != 0) {
          dVar57 = GetTime();
          fVar54 = fmodf((float)dVar57,0.4);
          if (fVar54 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar44 = GetKeyIndex(0xc);
          bVar27 = IsKeyPressed(iVar44,true);
          if (bVar27) {
            *(byte *)&pIVar36->ConfigFlags = (byte)pIVar36->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar36->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        CheckboxFlags("io.ConfigFlags: DockingEnable",&pIVar36->ConfigFlags,0x40);
        SameLine(0.0,-1.0);
        pcVar48 = 
        "Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
        ;
        if (pIVar36->ConfigDockingWithShift != false) {
          pcVar48 = 
          "Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
          ;
        }
        HelpMarker(pcVar48);
        if ((pIVar36->ConfigFlags & 0x40) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigDockingNoSplit",&pIVar36->ConfigDockingNoSplit);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars."
                    );
          Checkbox("io.ConfigDockingWithShift",&pIVar36->ConfigDockingWithShift);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)"
                    );
          Checkbox("io.ConfigDockingAlwaysTabBar",&pIVar36->ConfigDockingAlwaysTabBar);
          SameLine(0.0,-1.0);
          HelpMarker("Create a docking node and tab-bar on single floating windows.");
          Checkbox("io.ConfigDockingTransparentPayload",&pIVar36->ConfigDockingTransparentPayload);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge."
                    );
          Unindent(0.0);
        }
        CheckboxFlags("io.ConfigFlags: ViewportsEnable",&pIVar36->ConfigFlags,0x400);
        SameLine(0.0,-1.0);
        HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
        if ((pIVar36->ConfigFlags & 0x400) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigViewportsNoAutoMerge",&pIVar36->ConfigViewportsNoAutoMerge);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it."
                    );
          Checkbox("io.ConfigViewportsNoTaskBarIcon",&pIVar36->ConfigViewportsNoTaskBarIcon);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the task bar icon state right away)."
                    );
          Checkbox("io.ConfigViewportsNoDecoration",&pIVar36->ConfigViewportsNoDecoration);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the decoration right away)."
                    );
          Checkbox("io.ConfigViewportsNoDefaultParent",&pIVar36->ConfigViewportsNoDefaultParent);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the parenting right away)."
                    );
          Unindent(0.0);
        }
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar36->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar36->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar36->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar36->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar36->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar27 = TreeNode("Backend Flags");
      if (bVar27) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        local_e8._0_4_ = pIVar36->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_e8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_e8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_e8,4);
        CheckboxFlags("io.BackendFlags: PlatformHasViewports",(int *)local_e8,0x400);
        CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",(int *)local_e8,0x800);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_e8,8);
        CheckboxFlags("io.BackendFlags: RendererHasViewports",(int *)local_e8,0x1000);
        TreePop();
        Separator();
      }
      bVar27 = TreeNode("Style");
      if (bVar27) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar27 = TreeNode("Capture/Logging");
      if (bVar27) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_e8);
        if (bVar27) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar27 = CollapsingHeader("Window options",0);
    if (bVar27) {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar27 = BeginTable("split",3,0,(ImVec2 *)local_e8,0.0);
      if (bVar27) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("No docking",&ShowDemoWindow::no_docking);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar27 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar27) {
      bVar27 = TreeNode("Popups");
      if (bVar27) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Select..",(ImVec2 *)local_e8);
        if (bVar27) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar48 = "<None>";
        }
        else {
          pcVar48 = (&PTR_anon_var_dwarf_ffede_0025e7b0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar48,(char *)0x0);
        bVar27 = BeginPopup("my_select_popup",0);
        if (bVar27) {
          lVar46 = 0;
          Text("Aquarium");
          Separator();
          ppuVar53 = &PTR_anon_var_dwarf_ffede_0025e7b0;
          do {
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar27 = Selectable(*ppuVar53,false,0,(ImVec2 *)local_e8);
            if (bVar27) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar46;
            }
            lVar46 = lVar46 + 1;
            ppuVar53 = ppuVar53 + 1;
          } while (lVar46 != 5);
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Toggle..",(ImVec2 *)local_e8);
        if (bVar27) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar27 = BeginPopup("my_toggle_popup",0);
        if (bVar27) {
          pbVar45 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar46 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_ffede_0025e7b0 + lVar46),"",pbVar45,true);
            lVar46 = lVar46 + 8;
            pbVar45 = pbVar45 + 1;
          } while (lVar46 != 0x28);
          bVar27 = BeginMenu("Sub-menu",true);
          if (bVar27) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar27 = Button("Stacked Popup",(ImVec2 *)local_e8);
          if (bVar27) {
            OpenPopup("another popup",0);
          }
          bVar27 = BeginPopup("another popup",0);
          if (bVar27) {
            pbVar45 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar46 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_ffede_0025e7b0 + lVar46),"",pbVar45,true
                      );
              lVar46 = lVar46 + 8;
              pbVar45 = pbVar45 + 1;
            } while (lVar46 != 0x28);
            bVar27 = BeginMenu("Sub-menu",true);
            if (bVar27) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_e8._0_4_ = 0.0;
              local_e8._4_4_ = 0.0;
              bVar27 = Button("Stacked Popup",(ImVec2 *)local_e8);
              if (bVar27) {
                OpenPopup("another popup",0);
              }
              bVar27 = BeginPopup("another popup",0);
              if (bVar27) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("File Menu..",(ImVec2 *)local_e8);
        if (bVar27) {
          OpenPopup("my_file_popup",0);
        }
        bVar27 = BeginPopup("my_file_popup",0);
        if (bVar27) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar27 = TreeNode("Context menus");
      if (bVar27) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        lVar46 = 0;
        do {
          pcVar48 = *(char **)((long)&PTR_anon_var_dwarf_ffff2_0025e7e0 + lVar46);
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          Selectable(pcVar48,false,0,(ImVec2 *)local_e8);
          bVar27 = BeginPopupContextItem((char *)0x0,1);
          if (bVar27) {
            Text("This a popup for \"%s\"!",pcVar48);
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar27 = Button("Close",(ImVec2 *)local_e8);
            if (bVar27) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetTooltip("Right-click to open popup");
          }
          lVar46 = lVar46 + 8;
        } while (lVar46 != 0x28);
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",(double)ShowDemoWindowPopups()::value);
        bVar27 = BeginPopupContextItem("my popup",1);
        if (bVar27) {
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar27 = Selectable("Set to zero",false,0,(ImVec2 *)local_e8);
          if (bVar27) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar27 = Selectable("Set to PI",false,0,(ImVec2 *)local_e8);
          if (bVar27) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("(3) Or click this button",(ImVec2 *)local_e8);
        if (bVar27) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf(local_e8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_158.x = 0.0;
        local_158.y = 0.0;
        Button(local_e8,&local_158);
        bVar27 = BeginPopupContextItem((char *)0x0,1);
        if (bVar27) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,
                    (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Close",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar27 = TreeNode("Modals");
      if (bVar27) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Delete..",(ImVec2 *)local_e8);
        if (bVar27) {
          OpenPopup("Delete?",0);
        }
        pIVar35 = GetMainViewport();
        local_e8._0_4_ = (pIVar35->Size).x * 0.5 + (pIVar35->Pos).x;
        local_e8._4_4_ = (pIVar35->Size).y * 0.5 + (pIVar35->Pos).y;
        local_158.x = 0.5;
        local_158.y = 0.5;
        SetNextWindowPos((ImVec2 *)local_e8,8,&local_158);
        bVar27 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar27) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_158.x = 0.0;
          local_158.y = 0.0;
          PushStyleVar(0xb,&local_158);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar27 = Button("OK",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar27 = Button("Cancel",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar27 = Button("Stacked modals..",&local_158);
        if (bVar27) {
          OpenPopup("Stacked 1",0);
        }
        bVar27 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar27) {
          bVar27 = BeginMenuBar();
          if (bVar27) {
            bVar27 = BeginMenu("File",true);
            if (bVar27) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Add another modal..",&local_158);
          if (bVar27) {
            OpenPopup("Stacked 2",0);
          }
          local_120.x._0_1_ = 1;
          bVar27 = BeginPopupModal("Stacked 2",(bool *)&local_120,0);
          if (bVar27) {
            Text("Hello from Stacked The Second!");
            local_158.x = 0.0;
            local_158.y = 0.0;
            bVar27 = Button("Close",&local_158);
            if (bVar27) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Close",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar27 = TreeNode("Menus inside a regular window");
      if (bVar27) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar27 = BeginMenu("Menu inside a regular window",true);
        if (bVar27) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar27 = CollapsingHeader("Filtering",0);
    if (bVar27) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar44 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar44 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar46 = 0;
      do {
        bVar27 = ImGuiTextFilter::PassFilter
                           ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                            *(char **)((long)&PTR_anon_var_dwarf_1064d0_0025ea80 + lVar46),
                            (char *)0x0);
        if (bVar27) {
          BulletText("%s");
        }
        lVar46 = lVar46 + 8;
      } while (lVar46 != 0x40);
    }
    bVar27 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar27) {
      pIVar36 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar36->WantCaptureMouse);
      Text("WantCaptureMouseUnlessPopupClose: %d",(ulong)pIVar36->WantCaptureMouseUnlessPopupClose);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar36->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar36->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar36->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar36->NavActive,(ulong)pIVar36->NavVisible);
      bVar27 = TreeNode("Mouse State");
      if (bVar27) {
        bVar27 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar27) {
          Text("Mouse pos: (%g, %g)",(double)(pIVar36->MousePos).x,(double)(pIVar36->MousePos).y);
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)(pIVar36->MouseDelta).x);
        lVar46 = 0;
        Text("Mouse down:");
        do {
          bVar27 = IsMouseDown((ImGuiMouseButton)lVar46);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)pIVar36->MouseDownDuration[lVar46]);
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 != 5);
        Text("Mouse clicked:");
        iVar44 = 0;
        do {
          bVar27 = IsMouseClicked(iVar44,false);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar44 = iVar44 + 1;
        } while (iVar44 != 5);
        Text("Mouse dblclick:");
        uVar40 = 0;
        do {
          bVar27 = IsMouseDoubleClicked(uVar40);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar40);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 != 5);
        Text("Mouse released:");
        uVar73 = 0;
        do {
          bVar27 = IsMouseReleased((int)uVar73);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar73);
          }
          uVar40 = (int)uVar73 + 1;
          uVar73 = (ulong)uVar40;
        } while (uVar40 != 5);
        Text("Mouse wheel: %.1f",(double)pIVar36->MouseWheel);
        Text("Pen Pressure: %.1f",(double)pIVar36->PenPressure);
        TreePop();
      }
      bVar27 = TreeNode("Keyboard & Navigation State");
      if (bVar27) {
        uVar73 = 0;
        Text("Keys down:");
        do {
          bVar27 = IsKeyDown((int)uVar73);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",(double)pIVar36->KeysDownDuration[uVar73],
                 uVar73 & 0xffffffff,uVar73 & 0xffffffff);
          }
          uVar73 = uVar73 + 1;
        } while (uVar73 != 0x200);
        Text("Keys pressed:");
        uVar40 = 0;
        do {
          bVar27 = IsKeyPressed(uVar40,true);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar40,(ulong)uVar40);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 != 0x200);
        Text("Keys release:");
        uVar73 = 0;
        do {
          bVar27 = IsKeyReleased((int)uVar73);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar73,uVar73);
          }
          uVar40 = (int)uVar73 + 1;
          uVar73 = (ulong)uVar40;
        } while (uVar40 != 0x200);
        pcVar48 = "CTRL ";
        if (pIVar36->KeyCtrl == false) {
          pcVar48 = "";
        }
        pcVar47 = "SHIFT ";
        if (pIVar36->KeyShift == false) {
          pcVar47 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar48,pcVar47);
        Text("Chars queue:");
        if (0 < (pIVar36->InputQueueCharacters).Size) {
          lVar46 = 0;
          do {
            uVar3 = (pIVar36->InputQueueCharacters).Data[lVar46];
            SameLine(0.0,-1.0);
            uVar40 = (int)(char)uVar3;
            if (0xde < (ushort)(uVar3 - 0x21)) {
              uVar40 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar40,(ulong)uVar3);
            lVar46 = lVar46 + 1;
          } while (lVar46 < (pIVar36->InputQueueCharacters).Size);
        }
        uVar73 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar36->NavInputs[uVar73]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",(double)pIVar36->NavInputs[uVar73],uVar73 & 0xffffffff);
          }
          uVar73 = uVar73 + 1;
        } while (uVar73 != 0x14);
        Text("NavInputs pressed:");
        uVar73 = 0;
        do {
          if ((pIVar36->NavInputsDownDuration[uVar73] == 0.0) &&
             (!NAN(pIVar36->NavInputsDownDuration[uVar73]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar73 & 0xffffffff);
          }
          uVar73 = uVar73 + 1;
        } while (uVar73 != 0x14);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_e8);
        bVar27 = IsItemHovered(0);
        if (bVar27) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_e8);
        bVar27 = IsItemActive();
        if (bVar27) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar27 = TreeNode("Tabbing");
      if (bVar27) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,
                  (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        TreePop();
      }
      bVar27 = TreeNode("Focus from code");
      if (bVar27) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Focus on 1",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar28 = Button("Focus on 2",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar29 = Button("Focus on 3",(ImVec2 *)local_e8);
        if (bVar27) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        bVar27 = IsItemActive();
        uVar40 = (uint)bVar27;
        if (bVar28) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        bVar27 = IsItemActive();
        if (bVar27) {
          uVar40 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar29) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,
                  (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
        bVar27 = IsItemActive();
        if (bVar27) {
          uVar40 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar40 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar40);
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Focus on X",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar28 = Button("Focus on Y",(ImVec2 *)local_e8);
        iVar44 = 1;
        if (!bVar28) {
          iVar44 = bVar27 - 1;
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar27 = Button("Focus on Z",(ImVec2 *)local_e8);
        iVar69 = 2;
        if (!bVar27) {
          iVar69 = iVar44;
        }
        if (iVar69 != -1) {
          SetKeyboardFocusHere(iVar69);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar27 = TreeNode("Dragging");
      if (bVar27) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar40 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar40);
          bVar27 = IsMouseDragging(uVar40,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar27);
          bVar27 = IsMouseDragging(uVar40,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar27);
          bVar27 = IsMouseDragging(uVar40,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar27);
          uVar40 = uVar40 + 1;
        } while (uVar40 != 3);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_e8);
        bVar27 = IsItemActive();
        if (bVar27) {
          pIVar37 = GetForegroundDrawList();
          IVar31 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar37,pIVar36->MouseClickedPos,&pIVar36->MousePos,IVar31,4.0);
        }
        IVar58 = GetMouseDragDelta(0,0.0);
        uStack_110 = extraout_XMM0_Qb_02;
        local_118._0_4_ = IVar58.x;
        local_118._4_4_ = IVar58.y;
        local_48 = GetMouseDragDelta(0,-1.0);
        fVar54 = (pIVar36->MouseDelta).x;
        local_138 = (undefined1  [8])(double)(pIVar36->MouseDelta).y;
        uStack_40 = extraout_XMM0_Qb_03;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",(double)local_48.x,(double)local_48.y);
        Text("  w/ zero threshold: (%.1f, %.1f)",(double)(float)local_118._0_4_,
             (double)(float)local_118._4_4_);
        Text("io.MouseDelta: (%.1f, %.1f)",(double)fVar54,local_138);
        TreePop();
      }
      bVar27 = TreeNode("Mouse cursors");
      if (bVar27) {
        IVar33 = GetMouseCursor();
        puVar50 = &DAT_0025eac0;
        Text("Current mouse cursor = %d: %s",(long)IVar33,(&DAT_0025eac0)[IVar33]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar73 = 0;
        do {
          sprintf(local_e8,"Mouse cursor %d: %s",uVar73 & 0xffffffff,*puVar50);
          Bullet();
          local_158.x = 0.0;
          local_158.y = 0.0;
          Selectable(local_e8,false,0,&local_158);
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetMouseCursor((ImGuiMouseCursor)uVar73);
          }
          uVar73 = uVar73 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar73 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_dockspace = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_dockspace)           ShowExampleAppDockSpace(&show_app_dockspace);     // Process the Docking app first, as explicit DockSpace() nodes needs to be submitted early (read comments near the DockSpace function)
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);     // Process the Document app next, as it may also use a DockSpace()

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool no_docking = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_docking)         window_flags |= ImGuiWindowFlags_NoDocking;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Dockspace", NULL, &show_app_dockspace);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");

            ImGui::CheckboxFlags("io.ConfigFlags: DockingEnable", &io.ConfigFlags, ImGuiConfigFlags_DockingEnable);
            ImGui::SameLine();
            if (io.ConfigDockingWithShift)
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            else
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigDockingNoSplit", &io.ConfigDockingNoSplit);
                ImGui::SameLine(); HelpMarker("Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars.");
                ImGui::Checkbox("io.ConfigDockingWithShift", &io.ConfigDockingWithShift);
                ImGui::SameLine(); HelpMarker("Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)");
                ImGui::Checkbox("io.ConfigDockingAlwaysTabBar", &io.ConfigDockingAlwaysTabBar);
                ImGui::SameLine(); HelpMarker("Create a docking node and tab-bar on single floating windows.");
                ImGui::Checkbox("io.ConfigDockingTransparentPayload", &io.ConfigDockingTransparentPayload);
                ImGui::SameLine(); HelpMarker("Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge.");
                ImGui::Unindent();
            }

            ImGui::CheckboxFlags("io.ConfigFlags: ViewportsEnable", &io.ConfigFlags, ImGuiConfigFlags_ViewportsEnable);
            ImGui::SameLine(); HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
            if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigViewportsNoAutoMerge", &io.ConfigViewportsNoAutoMerge);
                ImGui::SameLine(); HelpMarker("Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it.");
                ImGui::Checkbox("io.ConfigViewportsNoTaskBarIcon", &io.ConfigViewportsNoTaskBarIcon);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the task bar icon state right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDecoration", &io.ConfigViewportsNoDecoration);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the decoration right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDefaultParent", &io.ConfigViewportsNoDefaultParent);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the parenting right away).");
                ImGui::Unindent();
            }

            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",             &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",        &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",         &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: PlatformHasViewports",   &backend_flags, ImGuiBackendFlags_PlatformHasViewports);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",&backend_flags, ImGuiBackendFlags_HasMouseHoveredViewport);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",   &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasViewports",   &backend_flags, ImGuiBackendFlags_RendererHasViewports);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("No docking", &no_docking);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}